

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Otter.cpp
# Opt level: O0

void __thiscall Saturation::Otter::onPassiveAdded(Otter *this,Clause *cl)

{
  Store SVar1;
  Clause *in_RSI;
  Clause *in_RDI;
  Clause *in_stack_00000038;
  SaturationAlgorithm *in_stack_00000040;
  
  SaturationAlgorithm::onPassiveAdded(in_stack_00000040,in_stack_00000038);
  SVar1 = Kernel::Clause::store(in_RSI);
  if (SVar1 == PASSIVE) {
    FakeContainer::add((FakeContainer *)in_RSI,in_RDI);
  }
  return;
}

Assistant:

void Otter::onPassiveAdded(Clause* cl)
{
  SaturationAlgorithm::onPassiveAdded(cl);

  if(cl->store()==Clause::PASSIVE) {
    _simplCont.add(cl);
  }
}